

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int wally_descriptor_to_addresses
              (char *descriptor,char **key_name_array,char **key_value_array,size_t array_len,
              uint32_t start_child_num,uint32_t end_child_num,uint32_t network,uint32_t flags,
              wally_descriptor_addresses *addresses)

{
  void *bytes;
  size_t size;
  int iVar1;
  wally_descriptor_script_item *script_item;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  address_script_t *address_item;
  ulong item_len;
  char **in_stack_ffffffffffffff98;
  wally_descriptor_address_item *local_60;
  
  iVar1 = -2;
  if (((start_child_num <= end_child_num) && (descriptor != (char *)0x0)) &&
     (addresses != (wally_descriptor_addresses *)0x0)) {
    if (network == 0xff) {
      address_item = g_network_address_table + 2;
    }
    else {
      lVar2 = 0;
      do {
        if ((&g_network_address_table[0].network)[lVar2] == network) {
          address_item = (address_script_t *)(&g_network_address_table[0].network + lVar2);
          goto LAB_00167425;
        }
        lVar2 = lVar2 + 0x10;
      } while (lVar2 != 0x50);
      address_item = (address_script_t *)0x0;
    }
LAB_00167425:
    if (address_item != (address_script_t *)0x0) {
      item_len = (ulong)((end_child_num - start_child_num) + 1);
      size = item_len * 0x18;
      local_60 = (wally_descriptor_address_item *)wally_malloc(size);
      iVar1 = -3;
      if (local_60 != (wally_descriptor_address_item *)0x0) {
        script_item = (wally_descriptor_script_item *)wally_malloc(size);
        if (script_item == (wally_descriptor_script_item *)0x0) {
          wally_free(local_60);
        }
        else {
          wally_bzero(local_60,size);
          wally_bzero(script_item,size);
          if (start_child_num <= end_child_num) {
            lVar2 = 0;
            do {
              *(uint32_t *)((long)&script_item->child_num + lVar2) = start_child_num;
              *(uint32_t *)((long)&local_60->child_num + lVar2) = start_child_num;
              start_child_num = start_child_num + 1;
              lVar2 = lVar2 + 0x18;
            } while (start_child_num <= end_child_num);
          }
          iVar1 = parse_miniscript(descriptor,key_name_array,key_value_array,array_len,flags,3,
                                   &network,0,0,script_item,item_len,(uint32_t *)0x0,
                                   in_stack_ffffffffffffff98);
          if ((iVar1 == 0) && (iVar1 = 0, item_len != 0)) {
            sVar4 = 0;
            do {
              iVar1 = descriptor_scriptpubkey_to_address
                                (address_item,*(uchar **)((long)&script_item->script + sVar4),
                                 *(size_t *)((long)&script_item->script_len + sVar4),
                                 (char **)((long)&local_60->address + sVar4));
              if (iVar1 != 0) goto LAB_00167562;
              sVar3 = strlen(*(char **)((long)&local_60->address + sVar4));
              *(size_t *)((long)&local_60->address_len + sVar4) = sVar3;
              sVar4 = sVar4 + 0x18;
            } while (size != sVar4);
            iVar1 = 0;
          }
LAB_00167562:
          if (iVar1 == 0) {
            addresses->items = local_60;
            addresses->num_items = item_len;
            local_60 = (wally_descriptor_address_item *)0x0;
          }
          if (item_len != 0) {
            sVar4 = 0;
            do {
              bytes = *(void **)((long)&script_item->script + sVar4);
              if (bytes != (void *)0x0) {
                wally_bzero(bytes,*(size_t *)((long)&script_item->script_len + sVar4));
                wally_free(*(void **)((long)&script_item->script + sVar4));
              }
              sVar4 = sVar4 + 0x18;
            } while (size != sVar4);
          }
          wally_bzero(script_item,size);
          wally_free(script_item);
          if (local_60 != (wally_descriptor_address_item *)0x0) {
            free_descriptor_address_item(local_60,item_len);
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int wally_descriptor_to_addresses(
    const char *descriptor,
    const char **key_name_array,
    const char **key_value_array,
    size_t array_len,
    uint32_t start_child_num,
    uint32_t end_child_num,
    uint32_t network,
    uint32_t flags,
    struct wally_descriptor_addresses *addresses)
{
    int ret;
    uint32_t child_num;
    uint32_t num_items;
    size_t index;
    size_t addr_tbl_max = sizeof(g_network_address_table) / sizeof(struct address_script_t);
    const struct address_script_t *addr_item = NULL;
    struct wally_descriptor_address_item *address_items = NULL;
    struct wally_descriptor_script_item *script_items = NULL;

    if (!addresses || !descriptor || (start_child_num > end_child_num))
        return WALLY_EINVAL;

    if (network == WALLY_NETWORK_BITCOIN_REGTEST)
        addr_item = &g_network_address_table[2];
    else
        for (index = 0; index < addr_tbl_max; ++index) {
            if (network == (uint32_t)g_network_address_table[index].network) {
                addr_item = &g_network_address_table[index];
                break;
            }
        }

    if (!addr_item)
        return WALLY_EINVAL;

    num_items = end_child_num - start_child_num + 1;

    address_items = (struct wally_descriptor_address_item *) wally_malloc(sizeof(struct wally_descriptor_address_item) * num_items);
    if (!address_items)
        return WALLY_ENOMEM;

    script_items = (struct wally_descriptor_script_item *) wally_malloc(sizeof(struct wally_descriptor_script_item) * num_items);
    if (!script_items) {
        wally_free((void *)address_items);
        return WALLY_ENOMEM;
    }
    wally_bzero(address_items, sizeof(struct wally_descriptor_address_item) * num_items);
    wally_bzero(script_items, sizeof(struct wally_descriptor_script_item) * num_items);

    index = 0;
    for (child_num = start_child_num; child_num <= end_child_num; ++child_num) {
        script_items[index].child_num = child_num;
        address_items[index].child_num = child_num;
        ++index;
    }

    ret = parse_miniscript(
        descriptor,
        key_name_array,
        key_value_array,
        array_len,
        flags,
        DESCRIPTOR_KIND_MINISCRIPT | DESCRIPTOR_KIND_DESCRIPTOR,
        (!addr_item) ? NULL : &network,
        0,
        0,
        script_items,
        num_items,
        NULL,
        NULL);
    if (ret == WALLY_OK) {
        for (index = 0; index < num_items; ++index) {
            ret = descriptor_scriptpubkey_to_address(addr_item,
                                                     script_items[index].script,
                                                     script_items[index].script_len,
                                                     &address_items[index].address);
            if (ret != WALLY_OK)
                break;
            address_items[index].address_len = strlen(address_items[index].address);
        }
    }

    if (ret == WALLY_OK) {
        addresses->items = address_items;
        addresses->num_items = num_items;
        address_items = NULL;
    }

    if (script_items) {
        for (index = 0; index < num_items; ++index) {
            if (script_items[index].script) {
                wally_bzero((char *)script_items[index].script, script_items[index].script_len);
                wally_free(script_items[index].script);
            }
        }
        wally_bzero((char *)script_items, sizeof(struct wally_descriptor_script_item) * num_items);
        wally_free((void *)script_items);
    }
    if (address_items)
        free_descriptor_address_item(address_items, num_items);
    return ret;
}